

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O0

void av1_vaq_frame_setup(AV1_COMP *cpi)

{
  uint uVar1;
  int iVar2;
  segmentation *seg_00;
  long in_RDI;
  int qindex_delta;
  double avg_ratio;
  int avg_energy;
  int resolution_change;
  int i;
  segmentation *seg;
  int base_qindex;
  RefreshFrameInfo *refresh_frame;
  AV1_COMMON *cm;
  bool local_46;
  bool local_45;
  int local_44;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  
  iVar3 = *(int *)(in_RDI + 0x3c1e8);
  seg_00 = (segmentation *)(in_RDI + 0x409b8);
  local_45 = false;
  if (*(long *)(in_RDI + 0x3c060) != 0) {
    local_46 = true;
    if (*(int *)(in_RDI + 0x3bfb8) == *(int *)(*(long *)(in_RDI + 0x3c060) + 0x10c)) {
      local_46 = *(int *)(in_RDI + 0x3bfbc) != *(int *)(*(long *)(in_RDI + 0x3c060) + 0x110);
    }
    local_45 = local_46;
  }
  uVar1 = (uint)local_45;
  if (uVar1 == 0) {
    iVar2 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x3bf80));
    if ((((iVar2 != 0) || ((*(byte *)(in_RDI + 0x3c176) & 1) != 0)) ||
        ((*(byte *)(in_RDI + 0x42d7a) & 1) != 0)) ||
       (((*(byte *)(in_RDI + 0x42d78) & 1) != 0 && (*(int *)(in_RDI + 0x607a8) == 0)))) {
      *(undefined4 *)(in_RDI + 0x81330) = 1;
      av1_enable_segmentation(seg_00);
      av1_clearall_segfeatures((segmentation *)0x6fb383);
      for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
        local_44 = av1_compute_qdelta_by_rate
                             ((AV1_COMP *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                              (FRAME_TYPE)((ulong)seg_00 >> 0x38),(int)seg_00,
                              (double)CONCAT44(iVar2,uVar1));
        if ((iVar3 != 0) && (iVar3 + local_44 == 0)) {
          local_44 = 1 - iVar3;
        }
        av1_set_segdata(seg_00,iVar2,'\0',local_44);
        av1_enable_segfeature(seg_00,iVar2,'\0');
      }
    }
  }
  else {
    memset(*(void **)(in_RDI + 0x71298),0,
           (long)(*(int *)(in_RDI + 0x3c194) * *(int *)(in_RDI + 0x3c198)));
    av1_clearall_segfeatures((segmentation *)0x6fb309);
    av1_disable_segmentation(seg_00);
  }
  return;
}

Assistant:

void av1_vaq_frame_setup(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const int base_qindex = cm->quant_params.base_qindex;
  struct segmentation *seg = &cm->seg;
  int i;

  int resolution_change =
      cm->prev_frame && (cm->width != cm->prev_frame->width ||
                         cm->height != cm->prev_frame->height);
  int avg_energy = (int)(cpi->twopass_frame.mb_av_energy - 2);
  double avg_ratio;
  if (avg_energy > 7) avg_energy = 7;
  if (avg_energy < 0) avg_energy = 0;
  avg_ratio = rate_ratio[avg_energy];

  if (resolution_change) {
    memset(cpi->enc_seg.map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
    av1_clearall_segfeatures(seg);
    av1_disable_segmentation(seg);
    return;
  }
  if (frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
      refresh_frame->alt_ref_frame ||
      (refresh_frame->golden_frame && !cpi->rc.is_src_frame_alt_ref)) {
    cpi->vaq_refresh = 1;

    av1_enable_segmentation(seg);
    av1_clearall_segfeatures(seg);

    for (i = 0; i < MAX_SEGMENTS; ++i) {
      // Set up avg segment id to be 1.0 and adjust the other segments around
      // it.
      int qindex_delta =
          av1_compute_qdelta_by_rate(cpi, cm->current_frame.frame_type,
                                     base_qindex, rate_ratio[i] / avg_ratio);

      // We don't allow qindex 0 in a segment if the base value is not 0.
      // Q index 0 (lossless) implies 4x4 encoding only and in AQ mode a segment
      // Q delta is sometimes applied without going back around the rd loop.
      // This could lead to an illegal combination of partition size and q.
      if ((base_qindex != 0) && ((base_qindex + qindex_delta) == 0)) {
        qindex_delta = -base_qindex + 1;
      }

      av1_set_segdata(seg, i, SEG_LVL_ALT_Q, qindex_delta);
      av1_enable_segfeature(seg, i, SEG_LVL_ALT_Q);
    }
  }
}